

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int subjournalPage(PgHdr *pPg)

{
  Pager *pPager_00;
  void *pBuf;
  long offset_00;
  char *pData2;
  i64 offset;
  void *pData;
  Pager *pPager;
  int rc;
  PgHdr *pPg_local;
  
  pPager._4_4_ = 0;
  pPager_00 = pPg->pPager;
  if ((pPager_00->journalMode != '\x02') &&
     (pPager._4_4_ = openSubJournal(pPager_00), pPager._4_4_ == 0)) {
    pBuf = pPg->pData;
    offset_00 = (ulong)pPager_00->nSubRec * (long)(pPager_00->pageSize + 4);
    pPager._4_4_ = write32bits(pPager_00->sjfd,offset_00,pPg->pgno);
    if (pPager._4_4_ == 0) {
      pPager._4_4_ = sqlite3OsWrite(pPager_00->sjfd,pBuf,pPager_00->pageSize,offset_00 + 4);
    }
  }
  if (pPager._4_4_ == 0) {
    pPager_00->nSubRec = pPager_00->nSubRec + 1;
    pPager._4_4_ = addToSavepointBitvecs(pPager_00,pPg->pgno);
  }
  return pPager._4_4_;
}

Assistant:

static int subjournalPage(PgHdr *pPg){
  int rc = SQLITE_OK;
  Pager *pPager = pPg->pPager;
  if( pPager->journalMode!=PAGER_JOURNALMODE_OFF ){

    /* Open the sub-journal, if it has not already been opened */
    assert( pPager->useJournal );
    assert( isOpen(pPager->jfd) || pagerUseWal(pPager) );
    assert( isOpen(pPager->sjfd) || pPager->nSubRec==0 );
    assert( pagerUseWal(pPager) 
         || pageInJournal(pPager, pPg) 
         || pPg->pgno>pPager->dbOrigSize 
    );
    rc = openSubJournal(pPager);

    /* If the sub-journal was opened successfully (or was already open),
    ** write the journal record into the file.  */
    if( rc==SQLITE_OK ){
      void *pData = pPg->pData;
      i64 offset = (i64)pPager->nSubRec*(4+pPager->pageSize);
      char *pData2;

#if SQLITE_HAS_CODEC   
      if( !pPager->subjInMemory ){
        CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM_BKPT, pData2);
      }else
#endif
      pData2 = pData;
      PAGERTRACE(("STMT-JOURNAL %d page %d\n", PAGERID(pPager), pPg->pgno));
      rc = write32bits(pPager->sjfd, offset, pPg->pgno);
      if( rc==SQLITE_OK ){
        rc = sqlite3OsWrite(pPager->sjfd, pData2, pPager->pageSize, offset+4);
      }
    }
  }
  if( rc==SQLITE_OK ){
    pPager->nSubRec++;
    assert( pPager->nSavepoint>0 );
    rc = addToSavepointBitvecs(pPager, pPg->pgno);
  }
  return rc;
}